

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictactoe.cpp
# Opt level: O3

string * __thiscall Game::CurrentPlayerName_abi_cxx11_(string *__return_storage_ptr__,Game *this)

{
  Player PVar1;
  char *pcVar2;
  char *pcVar3;
  
  PVar1 = this->m_currentPlayer;
  if (PVar1 == Circle) {
    pcVar2 = "";
    pcVar3 = "Circle";
  }
  else if (PVar1 == Cross) {
    pcVar2 = "";
    pcVar3 = "Cross";
  }
  else {
    if (PVar1 == None) {
      __assert_fail("m_currentPlayer != Player::None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AntoineJT[P]cpp-things/tictactoe.cpp"
                    ,0x8b,"std::string Game::CurrentPlayerName() const");
    }
    pcVar2 = "";
    pcVar3 = "Invalid";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string CurrentPlayerName() const noexcept {
            assert(m_currentPlayer != Player::None);

            switch (m_currentPlayer) {
                case Player::Cross: return "Cross";
                case Player::Circle: return "Circle";
                case Player::None:
                default:
                    return "Invalid";
            }
        }